

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O0

Maybe<unsigned_long> __thiscall
kj::TreeIndex<kj::TreeMap<kj::String,int>::Callbacks>::
find<kj::TreeMap<kj::String,int>::Entry,kj::StringPtr>
          (TreeIndex<kj::TreeMap<kj::String,int>::Callbacks> *this,
          ArrayPtr<kj::TreeMap<kj::String,_int>::Entry> table,char (*params) [7])

{
  bool bVar1;
  size_t index;
  StringPtr *e;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar2;
  TreeIndex<kj::TreeMap<kj::String,int>::Callbacks> *this_00;
  char (*in_R8) [7];
  Maybe<unsigned_long> MVar3;
  size_t local_70;
  SearchKeyImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_table_h:1530:22)>
  local_68;
  undefined1 local_48 [8];
  Iterator iter;
  char (*params_local) [7];
  HashIndex<kj::_::(anonymous_namespace)::StringHasher> *this_local;
  ArrayPtr<kj::TreeMap<kj::String,_int>::Entry> table_local;
  
  this_local = (HashIndex<kj::_::(anonymous_namespace)::StringHasher> *)table.size_;
  this_00 = (TreeIndex<kj::TreeMap<kj::String,int>::Callbacks> *)table.ptr;
  iter._16_8_ = in_R8;
  table_local.ptr = (StringPtr *)params;
  table_local.size_ = (size_t)this;
  searchKey<kj::TreeMap<kj::String,int>::Entry,kj::StringPtr>
            (&local_68,this_00,(ArrayPtr<kj::TreeMap<kj::String,_int>::Entry> *)&this_local,in_R8);
  kj::_::BTreeImpl::search((Iterator *)local_48,(BTreeImpl *)(this_00 + 8),(SearchKey *)&local_68);
  bVar1 = kj::_::BTreeImpl::Iterator::isEnd((Iterator *)local_48);
  if (!bVar1) {
    index = kj::_::BTreeImpl::Iterator::operator*((Iterator *)local_48);
    e = ArrayPtr<kj::TreeMap<kj::String,_int>::Entry>::operator[]
                  ((ArrayPtr<kj::TreeMap<kj::String,_int>::Entry> *)&this_local,index);
    bVar1 = TreeMap<kj::String,int>::Callbacks::matches<kj::StringPtr&>
                      ((Callbacks *)this_00,e,(char (*) [7])iter._16_8_);
    if (bVar1) {
      local_70 = kj::_::BTreeImpl::Iterator::operator*((Iterator *)local_48);
      Maybe<unsigned_long>::Maybe((Maybe<unsigned_long> *)this,&local_70);
      aVar2 = extraout_RDX;
      goto LAB_002517f8;
    }
  }
  Maybe<unsigned_long>::Maybe((Maybe<unsigned_long> *)this);
  aVar2 = extraout_RDX_00;
LAB_002517f8:
  MVar3.ptr.field_1.value = aVar2.value;
  MVar3.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar3.ptr;
}

Assistant:

Maybe<size_t> find(kj::ArrayPtr<Row> table, Params&&... params) const {
    auto iter = impl.search(searchKey(table, params...));

    if (!iter.isEnd() && cb.matches(table[*iter], params...)) {
      return size_t(*iter);
    } else {
      return kj::none;
    }
  }